

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O2

Node * __thiscall czh::node::Node::get_ref(Node *this,Reference *ref,source_location *l)

{
  Node *pNVar1;
  source_location *l_00;
  bool bVar2;
  Node *pNVar3;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __tmp;
  pointer tag;
  allocator<char> local_59;
  source_location *local_58;
  string local_50;
  
  tag = (ref->path).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish;
  pNVar3 = this;
  if (*(__index_type *)
       ((long)&(this->data).super__Variant_base<czh::node::Node::NodeData,_czh::value::Value>.
               super__Move_assign_alias<czh::node::Node::NodeData,_czh::value::Value>.
               super__Copy_assign_alias<czh::node::Node::NodeData,_czh::value::Value>.
               super__Move_ctor_alias<czh::node::Node::NodeData,_czh::value::Value>.
               super__Copy_ctor_alias<czh::node::Node::NodeData,_czh::value::Value>.
               super__Variant_storage_alias<czh::node::Node::NodeData,_czh::value::Value> + 0x48) !=
      '\0') {
    pNVar3 = this->last_node;
  }
  if (tag[-1]._M_string_length == 0) {
    tag = tag + -1;
    pNVar1 = pNVar3;
    do {
      pNVar3 = pNVar1;
      pNVar1 = pNVar3->last_node;
    } while (pNVar3->last_node != (Node *)0x0);
  }
  local_58 = l;
  while( true ) {
    if (tag <= (ref->path).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start) {
      return pNVar3;
    }
    tag = tag + -1;
    local_50._M_dataplus._M_p = (pointer)&PTR_s__workspace_llm4binary_github_lic_001956a0;
    bVar2 = has_node(pNVar3,tag,(source_location *)&local_50);
    if (!bVar2) break;
    pNVar3 = operator[](pNVar3,tag);
  }
  pNVar1 = pNVar3->last_node;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Unknown reference.",&local_59);
  l_00 = local_58;
  if (pNVar1 == (Node *)0x0) {
    report_error(&local_50,&this->czh_token,local_58);
  }
  std::__cxx11::string::~string((string *)&local_50);
  pNVar3 = get_ref(pNVar3->last_node,ref,l_00);
  return pNVar3;
}

Assistant:

Node *get_ref(const value::Reference &ref, const std::source_location &l =
    std::source_location::current()) const
    {
      Node *nptr = last_node;
      auto rit = ref.path.crbegin();
      if (is_node())
      {
        nptr = const_cast<Node *>(this);
      }
      if (rit->empty())
      {
        while (nptr->last_node != nullptr)
        {
          nptr = nptr->last_node;
        }
        rit++;
      }
  
      for (; rit < ref.path.crend(); ++rit)
      {
        if (!nptr->has_node(*rit))
        {
          assert_true(nptr->last_node != nullptr, "Unknown reference.", czh_token, l);
          return nptr->last_node->get_ref(ref, l);
        }
        else
        {
          nptr = &(*nptr)[*rit];
        }
      }
      return nptr;
    }